

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

uintmax_t ghc::filesystem::remove_all(path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  file_type fVar4;
  uint uVar5;
  error_category *peVar6;
  uintmax_t uVar7;
  format fmt;
  ulong uVar8;
  directory_iterator iter;
  error_code tec;
  file_status fs;
  directory_iterator local_80;
  filesystem *local_70;
  directory_iterator local_68;
  path local_58;
  int local_38;
  
  peVar6 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar6;
  paVar1 = &local_58._path.field_2;
  fmt = 0x385e71;
  local_58._path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"/","");
  path::postprocess_path_with_format(&local_58,fmt);
  iVar3 = path::compare(p,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._path._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._path._M_dataplus._M_p,local_58._path.field_2._M_allocated_capacity + 1
                   );
  }
  if (iVar3 == 0) {
    ec->_M_value = 0x5f;
    ec->_M_cat = peVar6;
    return 0xffffffffffffffff;
  }
  local_58._path._M_dataplus._M_p = local_58._path._M_dataplus._M_p & 0xffffffff00000000;
  uVar8 = 0;
  local_58._path._M_string_length = (size_type)peVar6;
  detail::status_ex((path *)&local_38,(error_code *)p,(file_status *)&local_58,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  if (local_38 == 3) {
    local_70 = (filesystem *)p;
    directory_iterator::directory_iterator(&local_80,p,ec);
    uVar8 = 0;
    while( true ) {
      directory_iterator::directory_iterator(&local_68);
      iVar3 = path::compare(&((local_80._impl.
                               super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_dir_entry)._path,
                            &((local_68._impl.
                               super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_dir_entry)._path);
      if (local_68._impl.
          super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68._impl.
                   super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      bVar2 = true;
      if (((iVar3 == 0) || (0x14 < (uint)ec->_M_value)) ||
         ((0x100005U >> (ec->_M_value & 0x1fU) & 1) == 0)) goto LAB_001dc27f;
      bVar2 = directory_entry::is_symlink
                        (&(local_80._impl.
                           super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_dir_entry,ec);
      if (ec->_M_value == 0) {
        if ((bVar2) ||
           (fVar4 = directory_entry::status_file_type
                              (&(local_80._impl.
                                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_dir_entry,ec), fVar4 != directory)) {
          if (ec->_M_value == 0) {
            remove((filesystem *)
                   &(local_80._impl.
                     super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_dir_entry,(char *)ec);
          }
          bVar2 = ec->_M_value == 0;
          uVar8 = uVar8 + bVar2;
        }
        else {
          uVar7 = remove_all(&((local_80._impl.
                                super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_dir_entry)._path,ec);
          uVar8 = uVar8 + uVar7;
          bVar2 = ec->_M_value == 0;
        }
      }
      else {
        bVar2 = false;
      }
      if (!bVar2) break;
      directory_iterator::impl::increment
                (local_80._impl.
                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,ec);
    }
    bVar2 = false;
LAB_001dc27f:
    p = (path *)local_70;
    if (local_80._impl.
        super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80._impl.
                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (!bVar2) {
      return 0xffffffffffffffff;
    }
  }
  if (ec->_M_value == 0) {
    uVar5 = remove((filesystem *)p,(char *)ec);
    uVar8 = uVar8 + (uVar5 & 0xff);
  }
  return -(ulong)(ec->_M_value != 0) | uVar8;
}

Assistant:

GHC_INLINE uintmax_t remove_all(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
    uintmax_t count = 0;
    if (p == "/") {
        ec = detail::make_error_code(detail::portable_error::not_supported);
        return static_cast<uintmax_t>(-1);
    }
    std::error_code tec;
    auto fs = status(p, tec);
    if (exists(fs) && is_directory(fs)) {
        for (auto iter = directory_iterator(p, ec); iter != directory_iterator(); iter.increment(ec)) {
            if (ec && !detail::is_not_found_error(ec)) {
                break;
            }
            bool is_symlink_result = iter->is_symlink(ec);
            if (ec)
                return static_cast<uintmax_t>(-1);
            if (!is_symlink_result && iter->is_directory(ec)) {
                count += remove_all(iter->path(), ec);
                if (ec) {
                    return static_cast<uintmax_t>(-1);
                }
            }
            else {
                if (!ec) {
                    remove(iter->path(), ec);
                }
                if (ec) {
                    return static_cast<uintmax_t>(-1);
                }
                ++count;
            }
        }
    }
    if (!ec) {
        if (remove(p, ec)) {
            ++count;
        }
    }
    if (ec) {
        return static_cast<uintmax_t>(-1);
    }
    return count;
}